

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

int nghttp2_check_method(uint8_t *value,size_t len)

{
  uint8_t *last;
  size_t len_local;
  uint8_t *value_local;
  int local_4;
  
  if (len == 0) {
    local_4 = 0;
  }
  else {
    for (value_local = value; value_local != value + len; value_local = value_local + 1) {
      if (VALID_METHOD_CHARS[*value_local] == '\0') {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int nghttp2_check_method(const uint8_t *value, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  for (last = value + len; value != last; ++value) {
    if (!VALID_METHOD_CHARS[*value]) {
      return 0;
    }
  }
  return 1;
}